

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Synchronize_Linked_Fields(FIELD *field)

{
  int iVar1;
  int local_24;
  int syncres;
  int res;
  FIELD *linked_field;
  FIELD *field_local;
  
  local_24 = 0;
  if (field == (FIELD *)0x0) {
    field_local._4_4_ = -2;
  }
  else if (field->link == (fieldnode *)0x0) {
    field_local._4_4_ = -1;
  }
  else {
    for (_syncres = field->link; _syncres != field; _syncres = _syncres->link) {
      iVar1 = Synchronize_Field(_syncres);
      if ((iVar1 != 0) && (local_24 == 0)) {
        local_24 = iVar1;
      }
    }
    field_local._4_4_ = local_24;
  }
  return field_local._4_4_;
}

Assistant:

static int Synchronize_Linked_Fields(FIELD * field)
{
  FIELD *linked_field;
  int res = E_OK;
  int syncres;

  if (!field)
    return(E_BAD_ARGUMENT);

  if (!field->link)
    return(E_SYSTEM_ERROR);

  for(linked_field = field->link; 
      linked_field!= field;
      linked_field = linked_field->link )
    {
      if (((syncres=Synchronize_Field(linked_field)) != E_OK) &&
          (res==E_OK))
        res = syncres;
    }
  return(res);
}